

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

deUint32 vkt::pipeline::anon_unknown_0::getUniqueColorsCount(ConstPixelBufferAccess *image)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  _Self local_70;
  _Self local_68;
  key_type local_5c;
  uint local_58;
  deUint32 pixelValue;
  deUint32 pixelNdx;
  uint local_44;
  undefined1 local_40 [4];
  deUint32 pixelCount;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  histogram;
  ConstPixelBufferAccess *image_local;
  
  histogram._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)image;
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         *)local_40);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth
                    ((ConstPixelBufferAccess *)
                     histogram._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight
                    ((ConstPixelBufferAccess *)
                     histogram._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iVar4 = tcu::ConstPixelBufferAccess::getDepth
                    ((ConstPixelBufferAccess *)
                     histogram._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_44 = iVar2 * iVar3 * iVar4;
  for (local_58 = 0; local_58 < local_44; local_58 = local_58 + 1) {
    pvVar5 = tcu::ConstPixelBufferAccess::getDataPtr
                       ((ConstPixelBufferAccess *)
                        histogram._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_5c = *(key_type *)((long)pvVar5 + (ulong)local_58 * 4);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)local_40,&local_5c);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)local_40);
    bVar1 = std::operator!=(&local_68,&local_70);
    if (bVar1) {
      pmVar6 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)local_40,&local_5c);
      *pmVar6 = *pmVar6 + 1;
    }
    else {
      pmVar6 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)local_40,&local_5c);
      *pmVar6 = 1;
    }
  }
  sVar7 = std::
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::size((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)local_40);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *)local_40);
  return (deUint32)sVar7;
}

Assistant:

deUint32 getUniqueColorsCount (const tcu::ConstPixelBufferAccess& image)
{
	DE_ASSERT(image.getFormat().getPixelSize() == 4);

	std::map<deUint32, deUint32>	histogram; // map<pixel value, number of occurrences>
	const deUint32					pixelCount	= image.getWidth() * image.getHeight() * image.getDepth();

	for (deUint32 pixelNdx = 0; pixelNdx < pixelCount; pixelNdx++)
	{
		const deUint32 pixelValue = *((const deUint32*)image.getDataPtr() + pixelNdx);

		if (histogram.find(pixelValue) != histogram.end())
			histogram[pixelValue]++;
		else
			histogram[pixelValue] = 1;
	}

	return (deUint32)histogram.size();
}